

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseExpression.cpp
# Opt level: O2

shared_ptr<Kandinsky::BaseExpression> __thiscall
Kandinsky::BaseExpression::makePtr<Kandinsky::Expression>(BaseExpression *this,Expression *arg)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Kandinsky::BaseExpression> sVar1;
  
  std::__shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2> *)this,
             &(arg->m_baseExpressionPtr).
              super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>);
  sVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Kandinsky::BaseExpression>)
         sVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BaseExpression> BaseExpression::makePtr<Expression>(const Expression& arg)
    {
        return arg.getBaseExpressionPtr();
    }